

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O1

void oonf_subsystem_initiate_shutdown(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = oonf_plugin_tree.list_head.next;
  if ((oonf_plugin_tree.list_head.next)->prev != oonf_plugin_tree.list_head.prev) {
    do {
      plVar1 = plVar2->next;
      if (plVar2[-4].prev != (list_entity *)0x0) {
        if ((log_global_mask[4] & 1) != 0) {
          oonf_log(LOG_SEVERITY_DEBUG,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0xdf,(void *)0x0,0,
                   "Initiate Shutdown: %s",plVar2[-7].next);
        }
        (*(code *)plVar2[-4].prev)();
      }
      plVar2 = plVar1;
    } while (plVar1->prev != oonf_plugin_tree.list_head.prev);
  }
  return;
}

Assistant:

void
oonf_subsystem_initiate_shutdown(void) {
  struct oonf_subsystem *plugin, *iterator;

  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, iterator) {
    if (plugin->initiate_shutdown) {
      OONF_DEBUG(LOG_PLUGINS, "Initiate Shutdown: %s", plugin->name);
      plugin->initiate_shutdown();
    }
  }
}